

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rhsUnscaled(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp,int i)

{
  uint *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  cpp_dec_float<100U,_int,_void> local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  pnVar2 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_d8,*pdVar4,(type *)0x0);
  tVar3 = boost::multiprecision::operator<
                    (pnVar2 + i,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_d8);
  if (tVar3) {
    pnVar2 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = *(undefined8 *)&pnVar2[i].m_backend.data;
    uStack_80 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    local_78 = *(undefined8 *)puVar1;
    uStack_70 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x20);
    local_68 = *(undefined8 *)puVar1;
    uStack_60 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x30);
    local_58 = *(undefined8 *)puVar1;
    uStack_50 = *(undefined8 *)(puVar1 + 2);
    local_48 = pnVar2[i].m_backend.exp;
    local_44 = pnVar2[i].m_backend.neg;
    local_40._0_4_ = pnVar2[i].m_backend.fpclass;
    local_40._4_4_ = pnVar2[i].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_d8,(soplex *)&local_88,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)-(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).scaleExp.data[i],i);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
         local_d8.data._M_elems._48_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
         local_d8.data._M_elems._56_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_d8.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
         local_d8.data._M_elems._40_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_d8.data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         local_d8.data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_d8.data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_d8.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_d8.exp;
    (__return_storage_ptr__->m_backend).neg = local_d8.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_d8.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_d8.prec_elem;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (&__return_storage_ptr__->m_backend,
               &(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::rhsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nRows());
   assert(i >= 0);

   if(lp.LPRowSetBase<R>::rhs(i) < R(infinity))
   {
      const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
      return spxLdexp(lp.LPRowSetBase<R>::rhs(i), -rowscaleExp[i]);
   }
   else
      return lp.LPRowSetBase<R>::rhs(i);
}